

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

int __thiscall
CLabelTable::Insert(CLabelTable *this,char *nname,aint nvalue,uint traits,short equPageNum)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  EType EVar6;
  bool bVar7;
  allocator<char> local_55;
  _Rb_tree_color local_54;
  key_type local_50;
  
  if ((traits & 0x20) == 0) {
    EVar6 = Relocation::deltaType;
    if ((traits & 6) == 0) {
      EVar6 = (uint)(PseudoORG != DISP_INSIDE_RELOCATE && Relocation::type != 0);
    }
  }
  else {
    EVar6 = traits >> 6 & REGULAR;
  }
  local_54 = nvalue;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,nname,&local_55);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
                  *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (&(this->symbols)._M_t._M_impl.super__Rb_tree_header == (_Rb_tree_header *)iVar4._M_node) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,nname,&local_55);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
             ::operator[](&this->symbols,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pmVar5->traits = traits;
    pmVar5->updatePass = pass;
    pmVar5->value = local_54;
    bVar7 = SUB41(traits & 1,0);
    pmVar5->used = bVar7;
    uVar3 = traits >> 2 & 1;
    sVar1 = -1;
    if (uVar3 != 0) {
      sVar1 = equPageNum;
    }
    if ((equPageNum != -1 & (byte)uVar3) == 0 && bVar7 == false) {
      sVar1 = getAddressPageNumber(local_54,(traits & 6) != 0);
    }
    pmVar5->page = sVar1;
    if ((traits & 1) != 0) {
      EVar6 = OFF;
    }
    pmVar5->isRelocatable = EVar6;
    iVar2 = 1;
  }
  else {
    uVar3 = *(uint *)((long)&iVar4._M_node[2]._M_parent + 4);
    if ((uVar3 >> 8 & 1) != 0) {
      WarningById(W_OPKEYWORD,nname,W_EARLY);
      uVar3 = *(uint *)((long)&iVar4._M_node[2]._M_parent + 4);
    }
    if ((((uVar3 & 2) != 0) || (*(short *)&iVar4._M_node[2]._M_parent == -1)) ||
       (iVar2 = 0, *(int *)&iVar4._M_node[2].field_0x4 < pass)) {
      iVar4._M_node[2]._M_color = local_54;
      if (((byte)traits >> 2 & equPageNum != -1) == 0) {
        equPageNum = getAddressPageNumber(local_54,(traits & 6) != 0);
      }
      iVar2 = 1;
      *(short *)&iVar4._M_node[2]._M_parent = equPageNum;
      *(uint *)((long)&iVar4._M_node[2]._M_parent + 4) = traits;
      *(EType *)((long)&iVar4._M_node[2]._M_left + 4) = EVar6;
      *(int *)&iVar4._M_node[2].field_0x4 = pass;
    }
  }
  return iVar2;
}

Assistant:

int CLabelTable::Insert(const char* nname, aint nvalue, unsigned traits, short equPageNum) {
	const bool IsUndefined = !!(traits & LABEL_IS_UNDEFINED);

	// the EQU/DEFL is relocatable when the expression itself is relocatable
	// the regular label is relocatable when relocation is active
	const Relocation::EType deltaType = \
			(traits&LABEL_HAS_RELOC_TRAIT) ? \
				(traits & LABEL_IS_RELOC ? Relocation::REGULAR : Relocation::OFF) : \
				(traits & (LABEL_IS_DEFL|LABEL_IS_EQU)) ? \
					Relocation::deltaType : \
					Relocation::type && DISP_INSIDE_RELOCATE != PseudoORG ? \
						Relocation::REGULAR : Relocation::OFF;
	// Find label in label table
	symbol_map_t::iterator labelIt = symbols.find(nname);
	if (symbols.end() != labelIt) {
		//if label already added (as used, or in previous pass), just refresh values
		auto& label = labelIt->second;
		if (label.traits&LABEL_IS_KEYWORD) WarningById(W_OPKEYWORD, nname, W_EARLY);
		bool needsUpdate = label.traits&LABEL_IS_DEFL || label.page == LABEL_PAGE_UNDEFINED || label.updatePass < pass;
		if (needsUpdate) {
			label.value = nvalue;
			if ((traits & LABEL_IS_EQU) && LABEL_PAGE_UNDEFINED != equPageNum) {
				label.page = equPageNum;
			} else {
				label.page = getAddressPageNumber(nvalue, traits & (LABEL_IS_DEFL|LABEL_IS_EQU));
			}
			label.traits = traits;
			label.isRelocatable = deltaType;
			label.updatePass = pass;
		}
		return needsUpdate;
	}
	auto& label = symbols[nname];
	label.traits = traits;
	label.updatePass = pass;
	label.value = nvalue;
	label.used = IsUndefined;
	if ((traits & LABEL_IS_EQU) && LABEL_PAGE_UNDEFINED != equPageNum) {
		label.page = equPageNum;
	} else {
		label.page = IsUndefined ? LABEL_PAGE_UNDEFINED : getAddressPageNumber(nvalue, traits & (LABEL_IS_DEFL|LABEL_IS_EQU));
	}
	label.isRelocatable = IsUndefined ? Relocation::OFF : deltaType;	// ignore "relocatable" for "undefined"
	return 1;
}